

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O2

JsErrorCode JsCreateReferenceError(JsValueRef message,JsValueRef *error)

{
  ScriptContext *scriptContext;
  ScriptContext *pSVar1;
  JsrtContext *pJVar2;
  RecyclableObject *value;
  JavascriptError *newError;
  JsErrorCode exitStatus;
  void *unaff_retaddr;
  undefined1 auStack_a8 [8];
  ScriptEntryExitRecord __entryExitRecord;
  EnterScriptObject __enterScriptObject;
  TTDRecorder _actionEntryPopper;
  AutoNestedHandledExceptionType local_2c [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  __enterScriptObject.library = (JavascriptLibrary *)0x0;
  pJVar2 = JsrtContext::GetCurrent();
  if (pJVar2 == (JsrtContext *)0x0) {
    exitStatus = JsErrorNoCurrentContext;
    goto LAB_00370bd8;
  }
  scriptContext = (((pJVar2->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr
  ;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_2c,ExceptionType_JavascriptException|ExceptionType_OutOfMemory);
  __entryExitRecord.frameIdOfScriptExitFunction = (void *)0x0;
  __entryExitRecord.scriptContext = (ScriptContext *)0x0;
  __entryExitRecord.next = (ScriptEntryExitRecord *)0x0;
  __entryExitRecord.returnAddrOfScriptEntryFunction = (void *)0x0;
  __entryExitRecord.addrOfReturnAddrOfScriptEntryFunction = (void *)0x0;
  auStack_a8 = (undefined1  [8])0x0;
  __entryExitRecord._0_1_ = 0;
  __entryExitRecord.savedImplicitCallFlags = ImplicitCall_HasNoInfo;
  __entryExitRecord._2_6_ = 0;
  Js::EnterScriptObject::EnterScriptObject
            ((EnterScriptObject *)&__entryExitRecord.handledExceptionType,scriptContext,
             (ScriptEntryExitRecord *)auStack_a8,unaff_retaddr,&stack0x00000000,true,true,true);
  Js::ScriptContext::OnScriptStart(scriptContext,true,true);
  Js::EnterScriptObject::VerifyEnterScript
            ((EnterScriptObject *)&__entryExitRecord.handledExceptionType);
  if (scriptContext->TTDShouldPerformRecordAction == true) {
    TTD::EventLog::RecordJsRTCreateReferenceError
              (scriptContext->threadContext->TTDLog,
               (TTDJsRTActionResultAutoRecorder *)&__enterScriptObject.library,message);
  }
  if (message == (JsValueRef)0x0) {
    exitStatus = JsErrorInvalidArgument;
  }
  else {
    if ((ulong)message >> 0x30 == 0) {
      value = Js::VarTo<Js::RecyclableObject>(message);
      pSVar1 = (((((value->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
               scriptContext.ptr;
      if (pSVar1 != scriptContext) {
        exitStatus = JsErrorWrongRuntime;
        if (pSVar1->threadContext != scriptContext->threadContext) goto LAB_00370bc6;
        message = Js::CrossSite::MarshalVar(scriptContext,value,false);
      }
    }
    if (error == (JsValueRef *)0x0) {
      exitStatus = JsErrorNullArgument;
    }
    else {
      *error = (JsValueRef)0x0;
      newError = Js::JavascriptLibrary::CreateReferenceError
                           ((scriptContext->super_ScriptContextBase).javascriptLibrary);
      SetErrorMessage(scriptContext,newError,message);
      *error = newError;
      exitStatus = JsNoError;
      if (scriptContext->TTDShouldPerformRecordAction == true) {
        TTD::TTDJsRTActionResultAutoRecorder::SetResult
                  ((TTDJsRTActionResultAutoRecorder *)&__enterScriptObject.library,error);
        exitStatus = JsNoError;
      }
    }
  }
LAB_00370bc6:
  Js::EnterScriptObject::~EnterScriptObject
            ((EnterScriptObject *)&__entryExitRecord.handledExceptionType);
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_2c);
LAB_00370bd8:
  TTD::TTDJsRTActionResultAutoRecorder::CompleteWithStatusCode
            ((TTDJsRTActionResultAutoRecorder *)&__enterScriptObject.library,exitStatus);
  return exitStatus;
}

Assistant:

CHAKRA_API JsCreateReferenceError(_In_ JsValueRef message, _Out_ JsValueRef *error)
{
    return ContextAPIWrapper<JSRT_MAYBE_TRUE>([&] (Js::ScriptContext * scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTCreateReferenceError, message);

        VALIDATE_INCOMING_REFERENCE(message, scriptContext);
        PARAM_NOT_NULL(error);
        *error = nullptr;

        Js::JavascriptError *newError = scriptContext->GetLibrary()->CreateReferenceError();
        SetErrorMessage(scriptContext, newError, message);
        *error = newError;

        PERFORM_JSRT_TTD_RECORD_ACTION_RESULT(scriptContext, error);

        return JsNoError;
    });
}